

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void indexedS16_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  cs_m680x_op *op;
  int16_t iVar4;
  
  lVar3 = (ulong)*address - (ulong)info->offset;
  lVar1 = lVar3 + 1;
  if ((uint)lVar1 < info->size) {
    address = (uint16_t *)info->code;
    iVar4 = CONCAT11(*(undefined1 *)((long)address + lVar3),*(undefined1 *)((long)address + lVar1));
  }
  else {
    iVar4 = 0;
  }
  bVar2 = (info->m680x).op_count;
  (info->m680x).op_count = bVar2 + 1;
  op = (info->m680x).operands + bVar2;
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,(uint8_t)address);
  *(undefined8 *)&(info->m680x).operands[bVar2].field_1 = 0xf;
  (info->m680x).operands[bVar2].field_1.idx.offset = iVar4;
  *(undefined4 *)((long)&(info->m680x).operands[bVar2].field_1 + 10) = 0x100000;
  return;
}

Assistant:

static void indexedS16_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint16_t offset = 0;

	read_word(info, &offset, *address);
	address += 2;

	add_indexed_operand(info, M680X_REG_S, false, 0, M680X_OFFSET_BITS_16,
		offset, false);
}